

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O0

void __thiscall cmFindCommon::InitializeSearchPathGroups(cmFindCommon *this)

{
  __enable_if_t<is_constructible<value_type,_pair<PathLabel,_cmSearchPath>_>::value,_pair<iterator,_bool>_>
  _Var1;
  cmSearchPath local_360;
  pair<cmFindCommon::PathLabel,_cmSearchPath> local_340;
  _Base_ptr local_2f8;
  undefined1 local_2f0;
  cmSearchPath local_2e8;
  pair<cmFindCommon::PathLabel,_cmSearchPath> local_2c8;
  _Base_ptr local_280;
  undefined1 local_278;
  cmSearchPath local_270;
  pair<cmFindCommon::PathLabel,_cmSearchPath> local_250;
  _Base_ptr local_208;
  undefined1 local_200;
  cmSearchPath local_1f8;
  pair<cmFindCommon::PathLabel,_cmSearchPath> local_1d8;
  _Base_ptr local_190;
  undefined1 local_188;
  cmSearchPath local_180;
  pair<cmFindCommon::PathLabel,_cmSearchPath> local_160;
  _Base_ptr local_118;
  undefined1 local_110;
  cmSearchPath local_108;
  pair<cmFindCommon::PathLabel,_cmSearchPath> local_e8;
  _Base_ptr local_a0;
  undefined1 local_98;
  cmSearchPath local_80;
  pair<cmFindCommon::PathLabel,_cmSearchPath> local_60;
  vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_> *local_18;
  vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_> *labels;
  cmFindCommon *this_local;
  
  labels = (vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_> *)this;
  local_18 = std::
             map<cmFindCommon::PathGroup,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>,_std::less<cmFindCommon::PathGroup>,_std::allocator<std::pair<const_cmFindCommon::PathGroup,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>_>_>_>
             ::operator[](&this->PathGroupLabelMap,&PathGroup::All);
  std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::push_back
            (local_18,&PathLabel::PackageRoot);
  std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::push_back
            (local_18,&PathLabel::CMake);
  std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::push_back
            (local_18,&PathLabel::CMakeEnvironment);
  std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::push_back
            (local_18,&PathLabel::Hints);
  std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::push_back
            (local_18,&PathLabel::SystemEnvironment);
  std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::push_back
            (local_18,&PathLabel::CMakeSystem);
  std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::push_back
            (local_18,&PathLabel::Guess);
  std::vector<cmFindCommon::PathGroup,_std::allocator<cmFindCommon::PathGroup>_>::push_back
            (&this->PathGroupOrder,&PathGroup::All);
  cmSearchPath::cmSearchPath(&local_80,this);
  std::make_pair<cmFindCommon::PathLabel&,cmSearchPath>(&local_60,&PathLabel::PackageRoot,&local_80)
  ;
  _Var1 = std::
          map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
          ::insert<std::pair<cmFindCommon::PathLabel,cmSearchPath>>
                    ((map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
                      *)&this->LabeledPaths,&local_60);
  local_a0 = (_Base_ptr)_Var1.first._M_node;
  local_98 = _Var1.second;
  std::pair<cmFindCommon::PathLabel,_cmSearchPath>::~pair(&local_60);
  cmSearchPath::~cmSearchPath(&local_80);
  cmSearchPath::cmSearchPath(&local_108,this);
  std::make_pair<cmFindCommon::PathLabel&,cmSearchPath>(&local_e8,&PathLabel::CMake,&local_108);
  _Var1 = std::
          map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
          ::insert<std::pair<cmFindCommon::PathLabel,cmSearchPath>>
                    ((map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
                      *)&this->LabeledPaths,&local_e8);
  local_118 = (_Base_ptr)_Var1.first._M_node;
  local_110 = _Var1.second;
  std::pair<cmFindCommon::PathLabel,_cmSearchPath>::~pair(&local_e8);
  cmSearchPath::~cmSearchPath(&local_108);
  cmSearchPath::cmSearchPath(&local_180,this);
  std::make_pair<cmFindCommon::PathLabel&,cmSearchPath>
            (&local_160,&PathLabel::CMakeEnvironment,&local_180);
  _Var1 = std::
          map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
          ::insert<std::pair<cmFindCommon::PathLabel,cmSearchPath>>
                    ((map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
                      *)&this->LabeledPaths,&local_160);
  local_190 = (_Base_ptr)_Var1.first._M_node;
  local_188 = _Var1.second;
  std::pair<cmFindCommon::PathLabel,_cmSearchPath>::~pair(&local_160);
  cmSearchPath::~cmSearchPath(&local_180);
  cmSearchPath::cmSearchPath(&local_1f8,this);
  std::make_pair<cmFindCommon::PathLabel&,cmSearchPath>(&local_1d8,&PathLabel::Hints,&local_1f8);
  _Var1 = std::
          map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
          ::insert<std::pair<cmFindCommon::PathLabel,cmSearchPath>>
                    ((map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
                      *)&this->LabeledPaths,&local_1d8);
  local_208 = (_Base_ptr)_Var1.first._M_node;
  local_200 = _Var1.second;
  std::pair<cmFindCommon::PathLabel,_cmSearchPath>::~pair(&local_1d8);
  cmSearchPath::~cmSearchPath(&local_1f8);
  cmSearchPath::cmSearchPath(&local_270,this);
  std::make_pair<cmFindCommon::PathLabel&,cmSearchPath>
            (&local_250,&PathLabel::SystemEnvironment,&local_270);
  _Var1 = std::
          map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
          ::insert<std::pair<cmFindCommon::PathLabel,cmSearchPath>>
                    ((map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
                      *)&this->LabeledPaths,&local_250);
  local_280 = (_Base_ptr)_Var1.first._M_node;
  local_278 = _Var1.second;
  std::pair<cmFindCommon::PathLabel,_cmSearchPath>::~pair(&local_250);
  cmSearchPath::~cmSearchPath(&local_270);
  cmSearchPath::cmSearchPath(&local_2e8,this);
  std::make_pair<cmFindCommon::PathLabel&,cmSearchPath>
            (&local_2c8,&PathLabel::CMakeSystem,&local_2e8);
  _Var1 = std::
          map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
          ::insert<std::pair<cmFindCommon::PathLabel,cmSearchPath>>
                    ((map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
                      *)&this->LabeledPaths,&local_2c8);
  local_2f8 = (_Base_ptr)_Var1.first._M_node;
  local_2f0 = _Var1.second;
  std::pair<cmFindCommon::PathLabel,_cmSearchPath>::~pair(&local_2c8);
  cmSearchPath::~cmSearchPath(&local_2e8);
  cmSearchPath::cmSearchPath(&local_360,this);
  std::make_pair<cmFindCommon::PathLabel&,cmSearchPath>(&local_340,&PathLabel::Guess,&local_360);
  std::
  map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
  ::insert<std::pair<cmFindCommon::PathLabel,cmSearchPath>>
            ((map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
              *)&this->LabeledPaths,&local_340);
  std::pair<cmFindCommon::PathLabel,_cmSearchPath>::~pair(&local_340);
  cmSearchPath::~cmSearchPath(&local_360);
  return;
}

Assistant:

void cmFindCommon::InitializeSearchPathGroups()
{
  std::vector<PathLabel>* labels;

  // Define the various different groups of path types

  // All search paths
  labels = &this->PathGroupLabelMap[PathGroup::All];
  labels->push_back(PathLabel::PackageRoot);
  labels->push_back(PathLabel::CMake);
  labels->push_back(PathLabel::CMakeEnvironment);
  labels->push_back(PathLabel::Hints);
  labels->push_back(PathLabel::SystemEnvironment);
  labels->push_back(PathLabel::CMakeSystem);
  labels->push_back(PathLabel::Guess);

  // Define the search group order
  this->PathGroupOrder.push_back(PathGroup::All);

  // Create the individual labeled search paths
  this->LabeledPaths.insert(
    std::make_pair(PathLabel::PackageRoot, cmSearchPath(this)));
  this->LabeledPaths.insert(
    std::make_pair(PathLabel::CMake, cmSearchPath(this)));
  this->LabeledPaths.insert(
    std::make_pair(PathLabel::CMakeEnvironment, cmSearchPath(this)));
  this->LabeledPaths.insert(
    std::make_pair(PathLabel::Hints, cmSearchPath(this)));
  this->LabeledPaths.insert(
    std::make_pair(PathLabel::SystemEnvironment, cmSearchPath(this)));
  this->LabeledPaths.insert(
    std::make_pair(PathLabel::CMakeSystem, cmSearchPath(this)));
  this->LabeledPaths.insert(
    std::make_pair(PathLabel::Guess, cmSearchPath(this)));
}